

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sndio.cpp
# Opt level: O0

int __thiscall anon_unknown.dwarf_238a35::SndioCapture::recordProc(SndioCapture *this)

{
  undefined8 uVar1;
  bool bVar2;
  ALuint AVar3;
  size_t sVar4;
  size_t sVar5;
  long lVar6;
  pointer this_00;
  long in_RDI;
  size_t got;
  size_t total;
  size_t todo;
  ll_ringbuffer_data_pair data;
  ALuint frameSize;
  ALCdevice *in_stack_ffffffffffffff90;
  RingBuffer *in_stack_ffffffffffffff98;
  bool local_51;
  ulong local_40;
  RingBuffer *local_30;
  size_t local_28;
  RingBuffer *in_stack_ffffffffffffffe0;
  size_t local_18;
  
  SetRTPriority();
  althrd_setname("alsoft-record");
  AVar3 = ALCdevice::frameSizeFromFmt(in_stack_ffffffffffffff90);
  do {
    while( true ) {
      bVar2 = std::atomic<bool>::load
                        ((atomic<bool> *)in_stack_ffffffffffffff98,
                         (memory_order)((ulong)in_stack_ffffffffffffff90 >> 0x20));
      local_51 = false;
      if (!bVar2) {
        local_51 = std::atomic<bool>::load
                             ((atomic<bool> *)in_stack_ffffffffffffff98,
                              (memory_order)((ulong)in_stack_ffffffffffffff90 >> 0x20));
      }
      if (local_51 == false) {
        return 0;
      }
      std::unique_ptr<RingBuffer,_std::default_delete<RingBuffer>_>::operator->
                ((unique_ptr<RingBuffer,_std::default_delete<RingBuffer>_> *)0x23e4ec);
      RingBuffer::getWriteVector(in_stack_ffffffffffffffe0);
      sVar4 = local_28 + local_18;
      if (sVar4 != 0) break;
      uVar1 = *(undefined8 *)(in_RDI + 0x10);
      sVar4 = minz(SUB168((ZEXT816(0) << 0x40 | ZEXT816(0x1000)) / ZEXT416(AVar3),0),
                   (ulong)*(uint *)(*(long *)(in_RDI + 8) + 0x10));
      sio_read(uVar1,recordProc::junk,sVar4 * AVar3);
    }
    local_40 = 0;
    local_28 = AVar3 * local_28;
    local_18 = AVar3 * local_18;
    sVar4 = minz(sVar4,(ulong)*(uint *)(*(long *)(in_RDI + 8) + 0x10));
    for (; local_40 < sVar4 * AVar3; local_40 = lVar6 + local_40) {
      if (local_28 == 0) {
        local_30 = in_stack_ffffffffffffffe0;
        local_28 = local_18;
      }
      in_stack_ffffffffffffff90 = *(ALCdevice **)(in_RDI + 0x10);
      in_stack_ffffffffffffff98 = local_30;
      sVar5 = minz(sVar4 * AVar3 - local_40,local_28);
      lVar6 = sio_read(in_stack_ffffffffffffff90,in_stack_ffffffffffffff98,sVar5);
      if (lVar6 == 0) {
        ALCdevice::handleDisconnect(*(ALCdevice **)(in_RDI + 8),"Failed to read capture samples");
        break;
      }
      local_30 = (RingBuffer *)
                 ((long)&(local_30->mWritePtr).super___atomic_base<unsigned_long>._M_i + lVar6);
      local_28 = local_28 - lVar6;
    }
    this_00 = std::unique_ptr<RingBuffer,_std::default_delete<RingBuffer>_>::operator->
                        ((unique_ptr<RingBuffer,_std::default_delete<RingBuffer>_> *)0x23e684);
    RingBuffer::writeAdvance(this_00,local_40 / AVar3);
  } while( true );
}

Assistant:

int SndioCapture::recordProc()
{
    SetRTPriority();
    althrd_setname(RECORD_THREAD_NAME);

    const ALuint frameSize{mDevice->frameSizeFromFmt()};

    while(!mKillNow.load(std::memory_order_acquire) &&
          mDevice->Connected.load(std::memory_order_acquire))
    {
        auto data = mRing->getWriteVector();
        size_t todo{data.first.len + data.second.len};
        if(todo == 0)
        {
            static char junk[4096];
            sio_read(mSndHandle, junk,
                minz(sizeof(junk)/frameSize, mDevice->UpdateSize)*frameSize);
            continue;
        }

        size_t total{0u};
        data.first.len  *= frameSize;
        data.second.len *= frameSize;
        todo = minz(todo, mDevice->UpdateSize) * frameSize;
        while(total < todo)
        {
            if(!data.first.len)
                data.first = data.second;

            size_t got{sio_read(mSndHandle, data.first.buf, minz(todo-total, data.first.len))};
            if(!got)
            {
                mDevice->handleDisconnect("Failed to read capture samples");
                break;
            }

            data.first.buf += got;
            data.first.len -= got;
            total += got;
        }
        mRing->writeAdvance(total / frameSize);
    }

    return 0;
}